

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

bool __thiscall
vkt::tessellation::(anonymous_namespace)::
contains<std::set<tcu::Vector<float,3>,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>,tcu::Vector<float,3>>
          (_anonymous_namespace_ *this,
          set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          *c,Vector<float,_3> *key)

{
  bool bVar1;
  _anonymous_namespace_ *p_Var2;
  Vector<float,_3> *extraout_RDX;
  _anonymous_namespace_ *p_Var3;
  _anonymous_namespace_ *p_Var4;
  
  p_Var3 = this + 8;
  p_Var4 = p_Var3;
  for (p_Var2 = this + 0x10; p_Var2 = *(_anonymous_namespace_ **)p_Var2,
      p_Var2 != (_anonymous_namespace_ *)0x0; p_Var2 = p_Var2 + (ulong)bVar1 * 8 + 0x10) {
    bVar1 = tessellation::anon_unknown_0::LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_>::
            operator()((LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *)(p_Var2 + 0x20),
                       (Vector<float,_3> *)c,key);
    if (!bVar1) {
      p_Var4 = p_Var2;
    }
    key = extraout_RDX;
  }
  p_Var2 = p_Var3;
  if ((p_Var4 != p_Var3) &&
     (bVar1 = tessellation::anon_unknown_0::LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_>
              ::operator()((LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *)c,
                           (Vector<float,_3> *)(p_Var4 + 0x20),key), p_Var2 = p_Var4, bVar1)) {
    p_Var2 = p_Var3;
  }
  return p_Var2 != p_Var3;
}

Assistant:

inline bool contains (const ContainerT& c, const T& key)
{
	return c.find(key) != c.end();
}